

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

bool Internal_FirstIsPartOfSecond(ON_SubDComponentPoint *first,ON_SubDComponentPoint *second)

{
  Type TVar1;
  Type TVar2;
  uint uVar3;
  ON_SubDVertex *vertex;
  ON_SubDEdge *pOVar4;
  ON_SubDFace *pOVar5;
  ON_SubDFace *f_1;
  ON_SubDEdge *e_1;
  ON_SubDFace *f;
  ON_SubDEdge *e;
  ON_SubDVertex *v;
  Type second_type;
  Type first_type;
  ON_SubDComponentPoint *second_local;
  ON_SubDComponentPoint *first_local;
  
  TVar1 = ON_SubDComponentPtr::ComponentType(&first->m_component_ptr);
  TVar2 = ON_SubDComponentPtr::ComponentType(&second->m_component_ptr);
  if (TVar1 != TVar2) {
    if (TVar1 == Vertex) {
      vertex = ON_SubDComponentPtr::Vertex(&first->m_component_ptr);
      if (vertex != (ON_SubDVertex *)0x0) {
        if (TVar2 == Edge) {
          pOVar4 = ON_SubDComponentPtr::Edge(&second->m_component_ptr);
          if ((pOVar4 != (ON_SubDEdge *)0x0) &&
             ((vertex == pOVar4->m_vertex[0] || (vertex == pOVar4->m_vertex[1])))) {
            return true;
          }
        }
        else if (((TVar2 == Face) &&
                 (pOVar5 = ON_SubDComponentPtr::Face(&second->m_component_ptr),
                 pOVar5 != (ON_SubDFace *)0x0)) &&
                (uVar3 = ON_SubDFace::VertexIndex(pOVar5,vertex), uVar3 != 0xffffffff)) {
          return true;
        }
      }
    }
    else if ((TVar1 == Edge) && (TVar2 == Face)) {
      pOVar4 = ON_SubDComponentPtr::Edge(&first->m_component_ptr);
      pOVar5 = ON_SubDComponentPtr::Face(&second->m_component_ptr);
      if ((pOVar4 != (ON_SubDEdge *)0x0) &&
         ((pOVar5 != (ON_SubDFace *)0x0 &&
          (uVar3 = ON_SubDEdge::FaceArrayIndex(pOVar4,pOVar5), uVar3 != 0xffffffff)))) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

static const bool Internal_FirstIsPartOfSecond(
  const ON_SubDComponentPoint& first,
  const ON_SubDComponentPoint& second
)
{
  // returns true if first is topologically part of second (vertex on edge, vertex on face, or edge on face).
  const ON_SubDComponentPtr::Type first_type = first.m_component_ptr.ComponentType();
  const ON_SubDComponentPtr::Type second_type = second.m_component_ptr.ComponentType();
  if (first_type != second_type)
  {
    if (ON_SubDComponentPtr::Type::Vertex == first_type)
    {
      const ON_SubDVertex* v = first.m_component_ptr.Vertex();
      if (nullptr != v)
      {
        if (ON_SubDComponentPtr::Type::Edge == second_type)
        {
          const ON_SubDEdge* e = second.m_component_ptr.Edge();
          if (nullptr != e && (v == e->m_vertex[0] || v == e->m_vertex[1]))
            return true;
        }
        else if (ON_SubDComponentPtr::Type::Face == second_type)
        {
          const ON_SubDFace* f = second.m_component_ptr.Face();
          if (nullptr != f && f->VertexIndex(v) < ON_UNSET_UINT_INDEX)
            return true;
        }
      }
    }
    else if (ON_SubDComponentPtr::Type::Edge == first_type)
    {
      if (ON_SubDComponentPtr::Type::Face == second_type)
      {
        const ON_SubDEdge* e = first.m_component_ptr.Edge();
        const ON_SubDFace* f = second.m_component_ptr.Face();
        if (nullptr != e && nullptr != f && e->FaceArrayIndex(f) < ON_UNSET_UINT_INDEX)
          return true;
      }
    }
  }
  return false;
}